

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppTest.cpp
# Opt level: O1

void __thiscall TApp_CallbackFlags_Test::~TApp_CallbackFlags_Test(TApp_CallbackFlags_Test *this)

{
  (this->super_TApp).super_Test._vptr_Test = (_func_int **)&PTR__TApp_001a09d8;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_TApp).args);
  CLI::App::~App(&(this->super_TApp).app);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, CallbackFlags) {

    int value = 0;

    auto func = [&value](size_t x) { value = x; };

    app.add_flag_function("-v", func);

    run();
    EXPECT_EQ(value, 0);

    app.reset();
    args = {"-v"};
    run();
    EXPECT_EQ(value, 1);

    app.reset();
    args = {"-vv"};
    run();
    EXPECT_EQ(value, 2);

    EXPECT_THROW(app.add_flag_function("hi", func), CLI::IncorrectConstruction);
}